

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

err_t bpkiCSRRewrap(octet *csr,size_t csr_len,octet *privkey,size_t privkey_len)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  octet *hash;
  size_t oid_len;
  bpki_csr_info_t ci [1];
  octet oid_der [16];
  bign_params params [1];
  
  oid_len = 0x10;
  if (privkey_len == 0x20) {
    bVar1 = memIsValid(csr,csr_len);
    eVar2 = 0x6d;
    if ((bVar1 != 0) && (bVar1 = memIsValid(privkey,0x20), bVar1 != 0)) {
      sVar3 = bpkiCSRDec(ci,csr,csr_len);
      eVar2 = 0x132;
      if ((sVar3 == csr_len && sVar3 != 0xffffffffffffffff) &&
         ((eVar2 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.1"), eVar2 == 0 &&
          (eVar2 = bignPubkeyCalc(csr + ci[0].pubkey_offset,params,privkey), eVar2 == 0)))) {
        bVar1 = rngIsValid();
        if (bVar1 != 0) {
          rngStepR(csr + ci[0].sig_offset,0x30,(void *)0x0);
        }
        eVar2 = bignOidToDER(oid_der,&oid_len,"1.2.112.0.2.0.34.101.31.81");
        if (eVar2 == 0) {
          hash = (octet *)blobCreate(0x20);
          if (hash == (octet *)0x0) {
            eVar2 = 0x6e;
          }
          else {
            eVar2 = beltHash(hash,csr + ci[0].body_offset,ci[0].body_len);
            if (eVar2 == 0) {
              eVar2 = bignSign2(csr + ci[0].sig_offset,params,oid_der,oid_len,hash,privkey,
                                csr + ci[0].sig_offset,0x30);
            }
            blobClose(hash);
          }
        }
      }
    }
  }
  else {
    eVar2 = 0x77;
  }
  return eVar2;
}

Assistant:

err_t bpkiCSRRewrap(octet csr[], size_t csr_len, const octet privkey[],
	size_t privkey_len)
{
	err_t code;
	size_t count;
	bpki_csr_info_t ci[1];
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	octet* hash;
	// входной контроль
	if (privkey_len != 32)
		return ERR_NOT_IMPLEMENTED;
	if (!memIsValid(csr, csr_len) || !memIsValid(privkey, 32))
		return ERR_BAD_INPUT;
	// разобрать запрос
	count = bpkiCSRDec(ci, csr, csr_len);
	if (count == SIZE_MAX || count != csr_len)
		return ERR_BAD_FORMAT;
	// загрузить стандартные параметры
	code = bignParamsStd(params, oid_bign_curve256v1);
	ERR_CALL_CHECK(code);
	// сгенерировать открытый ключ
	code = bignPubkeyCalc(csr + ci->pubkey_offset, params, privkey);
	ERR_CALL_CHECK(code);
	// получить случайные числа
	if (rngIsValid())
		rngStepR(csr + ci->sig_offset, 48, 0);
	// кодировать идентификатор алгоритма хэширования
	code = bignOidToDER(oid_der, &oid_len, oid_belt_hash);
	ERR_CALL_CHECK(code);
	// хэшировать
	if (!(hash = blobCreate(32)))
		return ERR_OUTOFMEMORY;
	code = beltHash(hash, csr + ci->body_offset, ci->body_len);
	ERR_CALL_HANDLE(code, blobClose(hash));
	// подписать
	code = bignSign2(csr + ci->sig_offset, params, oid_der, oid_len,
		hash, privkey, csr + ci->sig_offset, 48);
	// завершить
	blobClose(hash);
	return code;
}